

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O1

void erase_in_line(options *param_1)

{
  int row;
  uint uVar1;
  int iVar2;
  double dVar3;
  
  uVar1 = 1;
  iVar2 = 2;
  do {
    if (erase_in_line(options_const&)::pi == '\0') {
      erase_in_line();
    }
    dVar3 = sin(((double)erase_in_line::pi * (double)iVar2) / 24.0);
    printf("\x1b[%d;%dH\x1b[1K\x1b[24C\x1b[K",(ulong)uVar1,(ulong)(uint)(int)(dVar3 * 28.0 + 28.0));
    uVar1 = uVar1 + 1;
    iVar2 = iVar2 + 2;
  } while (iVar2 != 0x32);
  return;
}

Assistant:

void erase_in_line(const options &)
{
    for (int row = 1; row <= 24; ++row)
    {
        static const float pi = acos(-1.0f);
        int col = static_cast<int>((40-12) + (40-12)*std::sin(row*2.0*pi/24));
        std::printf("\033[%d;%dH\033[1K\033[24C\033[K", row, col);
    }
}